

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Usage(void)

{
  std::operator<<((ostream *)&std::cout,
                  "Command line options : sqlcheck <options>\n   -f -file_name          :  SQL file name\n   -r -risk_level         :  Set of anti-patterns to check\n                          :  1 (all anti-patterns, default) \n                          :  2 (only medium and high risk anti-patterns) \n                          :  3 (only high risk anti-patterns) \n   -c -color_mode         :  Display warnings in color mode \n   -v -verbose            :  Display verbose warnings \n   -d -delimiter          :  Query delimiter string (; by default) \n   -h -help               :  Print help message \n"
                 );
  return;
}

Assistant:

void Usage() {
  std::cout <<
      "Command line options : sqlcheck <options>\n"
      "   -f -file_name          :  SQL file name\n"
      "   -r -risk_level         :  Set of anti-patterns to check\n"
      "                          :  1 (all anti-patterns, default) \n"
      "                          :  2 (only medium and high risk anti-patterns) \n"
      "                          :  3 (only high risk anti-patterns) \n"
      "   -c -color_mode         :  Display warnings in color mode \n"
      "   -v -verbose            :  Display verbose warnings \n"
      "   -d -delimiter          :  Query delimiter string (; by default) \n"
      "   -h -help               :  Print help message \n";
}